

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_lnx_ModuleEnumerator.cpp
# Opt level: O0

bool axl::sys::lnx::parseProcModulesFile<axl::sys::lnx::EnumeratorModulesParser>
               (EnumeratorModulesParser *parser)

{
  bool bVar1;
  uint uVar2;
  StringRef *stateString;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *this;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *p_00;
  ulong offset_00;
  EnumeratorModulesParser *in_RDI;
  size_t offset;
  ModuleState state;
  size_t useCount;
  size_t size_1;
  StringRef name;
  char *next;
  char *eol;
  char *end;
  char *p;
  size_t size;
  Array<char,_axl::sl::ArrayDetails<char>_> buffer;
  bool result;
  File file;
  File *in_stack_000002f0;
  Array<char,_axl::sl::ArrayDetails<char>_> *in_stack_000002f8;
  undefined1 in_stack_fffffffffffffeef;
  ModuleState in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  C *in_stack_fffffffffffffef8;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *in_stack_ffffffffffffff00;
  ModuleState in_stack_ffffffffffffff24;
  size_t in_stack_ffffffffffffff28;
  size_t in_stack_ffffffffffffff30;
  StringRef *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  ModuleState MVar3;
  StringRef local_a8;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *local_88;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *local_80;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *local_78;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *local_70;
  ArrayRef<char,_axl::sl::ArrayDetails<char>_> local_60;
  int local_48;
  char local_38 [35];
  byte local_15;
  File local_14;
  EnumeratorModulesParser *local_10;
  byte local_1;
  
  local_10 = in_RDI;
  io::File::File((File *)0x1a9b3c);
  sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  uVar2 = io::File::open(&local_14,local_38,1);
  sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase
            ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)0x1a9b7f);
  local_15 = (byte)uVar2 & 1;
  if ((uVar2 & 1) == 0) {
    local_1 = 0;
    local_48 = 1;
  }
  else {
    sl::Array<char,_axl::sl::ArrayDetails<char>_>::Array
              ((Array<char,_axl::sl::ArrayDetails<char>_> *)0x1a9bfa);
    stateString = (StringRef *)io::readFile(in_stack_000002f8,in_stack_000002f0);
    if (stateString == (StringRef *)0xffffffffffffffff) {
      local_1 = 0;
    }
    else {
      this = (StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)
             sl::ArrayRef<char,_axl::sl::ArrayDetails<char>_>::cp(&local_60);
      local_70 = this;
      p_00 = (StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)
             sl::ArrayRef<char,_axl::sl::ArrayDetails<char>_>::getEnd(&local_60);
      local_78 = p_00;
      while (local_70 < local_78) {
        local_80 = (StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)
                   memchr(local_70,10,(long)local_78 - (long)local_70);
        if (local_80 == (StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)0x0) {
          local_80 = local_78;
        }
        local_88 = (StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)
                   memchr(local_70,0x20,(long)local_80 - (long)local_70);
        if (local_88 != (StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)0x0) {
          sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase
                    (this,(C *)p_00,CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                     (bool)in_stack_fffffffffffffeef);
          bVar1 = EnumeratorModulesParser::checkModuleName(local_10,&local_a8);
          in_stack_fffffffffffffef4 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffef4);
          if (bVar1) {
            local_70 = (StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)
                       ((long)&local_88->m_p + 1);
            strtoul((char *)local_70,(char **)&local_88,0);
            if ((local_88 == local_70) || (*(char *)&local_88->m_p != ' ')) {
              local_48 = 4;
            }
            else {
              local_70 = (StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)
                         ((long)&local_88->m_p + 1);
              strtoul((char *)local_70,(char **)&local_88,0);
              if ((local_88 == local_70) || (*(char *)&local_88->m_p != ' ')) {
                local_48 = 4;
              }
              else {
                local_70 = (StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)
                           ((long)&local_88->m_p + 1);
                local_88 = (StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)
                           memchr(local_70,0x20,(long)local_80 - (long)local_70);
                if (local_88 == (StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)0x0) {
                  local_48 = 4;
                  local_88 = (StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)0x0;
                }
                else {
                  local_70 = (StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)
                             ((long)&local_88->m_p + 1);
                  local_88 = (StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)
                             memchr(local_70,0x20,(long)local_80 - (long)local_70);
                  if (local_88 == (StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)0x0) {
                    local_48 = 4;
                  }
                  else {
                    sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase
                              (this,(C *)p_00,
                               CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                               (bool)in_stack_fffffffffffffeef);
                    in_stack_fffffffffffffef0 = parseModuleState(stateString);
                    sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase
                              ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)0x1a9f61);
                    if (in_stack_fffffffffffffef0 == ModuleState_Unknown) {
                      local_48 = 4;
                    }
                    else {
                      local_70 = (StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)
                                 ((long)&local_88->m_p + 1);
                      MVar3 = in_stack_fffffffffffffef0;
                      offset_00 = strtoul((char *)local_70,(char **)&local_88,0);
                      if (local_88 == local_70) {
                        local_48 = 4;
                      }
                      else {
                        in_stack_fffffffffffffeef =
                             EnumeratorModulesParser::processModule
                                       ((EnumeratorModulesParser *)
                                        CONCAT44(MVar3,in_stack_ffffffffffffff40),
                                        in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                                        in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,
                                        offset_00);
                        local_15 = in_stack_fffffffffffffeef;
                        if ((bool)in_stack_fffffffffffffeef) {
                          local_48 = 0;
                        }
                        else {
                          local_48 = 2;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          else {
            local_48 = 4;
          }
          sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase
                    ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)0x1aa057);
          if ((local_48 != 0) && (local_48 == 2)) break;
        }
        local_70 = (StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)
                   ((long)&local_80->m_p + 1);
      }
      local_1 = 1;
    }
    local_48 = 1;
    sl::Array<char,_axl::sl::ArrayDetails<char>_>::~Array
              ((Array<char,_axl::sl::ArrayDetails<char>_> *)0x1aa0ba);
  }
  io::File::~File((File *)0x1aa0d8);
  return (bool)(local_1 & 1);
}

Assistant:

bool
parseProcModulesFile(Parser& parser) {
	io::File file;
	bool result = file.open("/proc/modules", io::FileFlag_ReadOnly);
	if (!result)
		return false;

	sl::Array<char> buffer;
	size_t size = io::readFile(&buffer, &file);
	if (size == -1)
		return false;

	const char* p = buffer.cp();
	const char* end = buffer.getEnd();
	const char* eol;

	for (; p < end; p = eol + 1) {
		eol = (char*)memchr(p, '\n', end - p);
		if (!eol)
			eol = end;

		char* next = (char*)memchr(p, ' ', eol - p);
		if (!next)
			continue;

		sl::StringRef name(p, next - p);
		if (!parser.checkModuleName(name))
			continue;

		p = next + 1;

		size_t size = strtoul(p, &next, 0);
		if (next == p || *next != ' ')
			continue;

		p = next + 1;
		size_t useCount = strtoul(p, &next, 0);
		if (next == p || *next != ' ')
			continue;

		p = next + 1;
		next = (char*)memchr(p, ' ', eol - p);
		if (!next)
			continue;

		p = next + 1;
		next = (char*)memchr(p, ' ', eol - p);
		if (!next)
			continue;

		ModuleState state = parseModuleState(sl::StringRef(p, next - p));
		if (!state)
			continue;

		p = next + 1;
		size_t offset = strtoul(p, &next, 0);
		if (next == p)
			continue;

		result = parser.processModule(name, size, useCount, state, offset);
		if (!result)
			break;
	}

	return true;
}